

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentRandom.cpp
# Opt level: O1

Index __thiscall AgentRandom::Act(AgentRandom *this)

{
  _func_int *p_Var1;
  unsigned_long uVar2;
  uint uVar3;
  int iVar4;
  Index IVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  undefined1 auVar6 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrAis;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  undefined1 auVar8 [64];
  
  __x = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
        (**(code **)(**(long **)(*(long *)(&(this->super_AgentFullyObservable).field_0x10 +
                                          (long)(this->super_AgentFullyObservable).
                                                _vptr_AgentFullyObservable[-3]) + 0x30) + 0x58))();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_28,__x);
  p_Var1 = (this->super_AgentFullyObservable)._vptr_AgentFullyObservable[-3];
  uVar3 = (**(code **)(*(long *)((long)&(this->super_AgentFullyObservable).
                                        _vptr_AgentFullyObservable + (long)p_Var1) + 0x10))
                    ((_func_int *)
                     ((long)&(this->super_AgentFullyObservable)._vptr_AgentFullyObservable +
                     (long)p_Var1));
  auVar8._8_56_ = extraout_var;
  auVar8._0_8_ = extraout_XMM1_Qa;
  auVar7 = auVar8._0_16_;
  uVar2 = local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3];
  iVar4 = rand();
  if (local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  auVar7 = vcvtusi2sd_avx512f(auVar7,uVar2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (double)iVar4 * 4.656612873077393e-10 * auVar7._0_8_;
  IVar5 = vcvttsd2usi_avx512f(auVar6);
  return IVar5;
}

Assistant:

Index AgentRandom::Act()
{
    vector<size_t> nrAis=GetPU()->GetNrActions();
    Index aI=static_cast<Index>(nrAis[GetIndex()]*
                                  (rand() / (RAND_MAX + 1.0)));
    return(aI);
}